

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest::TextSerializerTest(TextSerializerTest *this)

{
  allocator local_11;
  TextSerializerTest *local_10;
  TextSerializerTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TextSerializerTest_00271040;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->name,"my_metric",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  ClientMetric::ClientMetric(&this->metric);
  TextSerializer::TextSerializer(&this->textSerializer);
  return;
}

Assistant:

std::string Serialize(MetricType type) const {
    MetricFamily metricFamily;
    metricFamily.name = name;
    metricFamily.help = "my metric help text";
    metricFamily.type = type;
    metricFamily.metric = std::vector<ClientMetric>{metric};

    std::vector<MetricFamily> families{metricFamily};

    return textSerializer.Serialize(families);
  }